

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O2

void on_underlying_ws_open_complete(void *context,WS_OPEN_RESULT open_result)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  code *UNRECOVERED_JUMPTABLE_00;
  undefined8 in_RDX;
  undefined8 uVar1;
  undefined8 uStack_8;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                 ,"on_underlying_ws_open_complete",0x139,1,
                 "NULL context in on_underlying_ws_open_complete");
      return;
    }
    return;
  }
  if (*(int *)((long)context + 0x40) == 1) {
    if (open_result == WS_OPEN_OK) {
      *(undefined4 *)((long)context + 0x40) = 2;
      UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x10);
      uVar1 = *(undefined8 *)((long)context + 0x18);
      uStack_8 = 1;
    }
    else if (open_result == WS_OPEN_CANCELLED) {
      *(undefined4 *)((long)context + 0x40) = 0;
      UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x10);
      uVar1 = *(undefined8 *)((long)context + 0x18);
      uStack_8 = 3;
    }
    else {
      *(undefined4 *)((long)context + 0x40) = 0;
      UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x10);
      uVar1 = *(undefined8 *)((long)context + 0x18);
      uStack_8 = 2;
    }
    (*UNRECOVERED_JUMPTABLE_00)(uVar1,uStack_8,in_RDX,UNRECOVERED_JUMPTABLE_00);
    return;
  }
  *(undefined4 *)((long)context + 0x40) = 4;
  (**(code **)((long)context + 0x20))(*(undefined8 *)((long)context + 0x28));
  return;
}

Assistant:

static void on_underlying_ws_open_complete(void* context, WS_OPEN_RESULT open_result)
{
    if (context == NULL)
    {
        /* Codes_SRS_WSIO_01_138: [ When on_underlying_ws_open_complete is called with a NULL context, it shall do nothing. ]*/
        LogError("NULL context in on_underlying_ws_open_complete");
    }
    else
    {
        WSIO_INSTANCE* wsio_instance = (WSIO_INSTANCE*)context;

        switch (wsio_instance->io_state)
        {
        default:
        /* Codes_SRS_WSIO_01_142: [ When on_underlying_ws_open_complete is called while in the CLOSING state an error shall be indicated by calling the on_io_error callback passed to wsio_open. ]*/
        case IO_STATE_CLOSING:
        /* Codes_SRS_WSIO_01_141: [ When on_underlying_ws_open_complete is called while in the ERROR state it shall indicate an error by calling the on_io_error callback passed to wsio_open. ]*/
        case IO_STATE_ERROR:
        /* Codes_SRS_WSIO_01_139: [ When on_underlying_ws_open_complete is called while in OPEN state it shall indicate an error by calling the on_io_error callback passed to wsio_open and switch to the ERROR state. ]*/
        case IO_STATE_OPEN:
            /* Codes_SRS_WSIO_01_140: [ When calling on_io_error, the on_io_error_context argument given in wsio_open shall be passed to the callback on_io_error. ]*/
            indicate_error(wsio_instance);
            break;

        case IO_STATE_OPENING:
            wsio_instance->io_state = IO_STATE_OPEN;

            switch (open_result)
            {
            default:
                /* Codes_SRS_WSIO_01_137: [ When on_underlying_ws_open_complete is called with any other error code while the IO is opening, the callback on_io_open_complete shall be called with IO_OPEN_ERROR. ]*/
                wsio_instance->io_state = IO_STATE_NOT_OPEN;
                indicate_open_complete(wsio_instance, IO_OPEN_ERROR);
                break;

            case WS_OPEN_CANCELLED:
                /* Codes_SRS_WSIO_01_149: [ When on_underlying_ws_open_complete is called with WS_OPEN_CANCELLED while the IO is opening, the callback on_io_open_complete shall be called with IO_OPEN_CANCELLED. ]*/
                wsio_instance->io_state = IO_STATE_NOT_OPEN;
                indicate_open_complete(wsio_instance, IO_OPEN_CANCELLED);
                break;

            case WS_OPEN_OK:
                /* Codes_SRS_WSIO_01_136: [ When on_underlying_ws_open_complete is called with WS_OPEN_OK while the IO is opening, the callback on_io_open_complete shall be called with IO_OPEN_OK. ]*/
                wsio_instance->io_state = IO_STATE_OPEN;
                indicate_open_complete(wsio_instance, IO_OPEN_OK);
                break;
            }

            break;
        }
    }
}